

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

json_string *
JSONWorker::RemoveWhiteSpaceAndComments
          (json_string *__return_storage_ptr__,json_string *value_t,bool escapeQuotes)

{
  char *p;
  allocator local_31;
  ulong local_30;
  size_t len;
  json_auto<char> s;
  bool escapeQuotes_local;
  json_string *value_t_local;
  
  s.ptr._7_1_ = escapeQuotes;
  json_auto<char>::json_auto((json_auto<char> *)&len);
  p = private_RemoveWhiteSpace<false>(value_t,(bool)(s.ptr._7_1_ & 1),&local_30);
  json_auto<char>::set((json_auto<char> *)&len,p);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)len,local_30,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  json_auto<char>::~json_auto((json_auto<char> *)&len);
  return __return_storage_ptr__;
}

Assistant:

json_string JSONWorker::RemoveWhiteSpaceAndComments(const json_string & value_t, bool escapeQuotes) json_nothrow {
	json_auto<json_char> s;
    size_t len;
	s.set(PRIVATE_REMOVEWHITESPACE(false, value_t, escapeQuotes, len)); 
	return json_string(s.ptr, len);
}